

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double empirical_discrete_variance(int a,double *b,double *c)

{
  double dVar1;
  double dVar2;
  double dVar3;
  __type _Var4;
  double local_40;
  double variance;
  double mean;
  int i;
  double bsum;
  double *c_local;
  double *b_local;
  int a_local;
  
  dVar2 = r8vec_sum(a,b);
  dVar3 = empirical_discrete_mean(a,b,c);
  local_40 = 0.0;
  for (mean._4_4_ = 0; mean._4_4_ < a; mean._4_4_ = mean._4_4_ + 1) {
    dVar1 = b[mean._4_4_];
    _Var4 = std::pow<double,int>(c[mean._4_4_] - dVar3,2);
    local_40 = (dVar1 / dVar2) * _Var4 + local_40;
  }
  return local_40;
}

Assistant:

double empirical_discrete_variance ( int a, double b[], double c[] )

//****************************************************************************80
//
//  Purpose:
//
//    EMPIRICAL_DISCRETE_VARIANCE returns the variance of the Empirical Discrete PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    18 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int A, the number of values.
//    0 < A.
//
//    Input, double B(A), the weights of each value.
//    0 <= B(1:A) and at least one value is nonzero.
//
//    Input, double C(A), the values.
//    The values must be distinct and in ascending order.
//
//    Output, double EMPIRICAL_DISCRETE_VARIANCE, the variance of the PDF.
//
{
  double bsum;
  int i;
  double mean;
  double variance;

  bsum = r8vec_sum ( a, b );

  mean = empirical_discrete_mean ( a, b, c );

  variance = 0.0;

  for ( i = 0; i < a; i++ )
  {
    variance = variance + ( b[i] / bsum ) * pow ( c[i] - mean, 2 );
  }

  return variance;
}